

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall
cimg_library::CImg<char>::_load_raw
          (CImg<char> *this,FILE *file,char *filename,uint size_x,uint size_y,uint size_z,
          uint size_c,bool is_multiplexed,bool invert_endianness,ulongT offset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  CImgArgumentException *pCVar7;
  char *pcVar8;
  char *pcVar9;
  long __off;
  char *local_168;
  FILE *local_130;
  uint local_a4;
  uint local_a0;
  int x;
  int y;
  int z;
  CImg<char> buf;
  longT fpos;
  FILE *nfile;
  uint _size_c;
  uint _size_z;
  uint _size_y;
  uint _size_x;
  ulongT siz;
  bool invert_endianness_local;
  bool is_multiplexed_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  char *filename_local;
  FILE *file_local;
  CImg<char> *this_local;
  
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    pcVar5 = this->_data;
    pcVar8 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar8 = "";
    }
    pcVar9 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (pCVar7,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,pcVar5,pcVar8,pcVar9);
    __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  bVar6 = cimg::is_directory(filename);
  if (bVar6) {
    pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    pcVar5 = this->_data;
    pcVar8 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar8 = "";
    }
    pcVar9 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (pCVar7,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Specified filename \'%s\' is a directory."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,pcVar5,pcVar8,pcVar9,filename);
    __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  __size_y = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  nfile._0_4_ = size_c;
  local_130 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_130 = cimg::fopen(filename,"rb");
  }
  nfile._4_4_ = size_z;
  _size_c = size_y;
  _size_z = size_x;
  if (__size_y == 0) {
    __off = cimg::ftell(local_130);
    if (__off < 0) {
      pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      pcVar5 = this->_data;
      pcVar8 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar8 = "";
      }
      pcVar9 = pixel_type();
      local_168 = filename;
      if (filename == (char *)0x0) {
        local_168 = "(FILE*)";
      }
      CImgArgumentException::CImgArgumentException
                (pCVar7,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Cannot determine size of input file \'%s\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,pcVar5,pcVar8,pcVar9,local_168
                );
      __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,
                  CImgArgumentException::~CImgArgumentException);
    }
    cimg::fseek(local_130,0,2);
    __size_y = cimg::ftell(local_130);
    _size_c = (uint)__size_y;
    nfile._0_4_ = 1;
    nfile._4_4_ = 1;
    _size_z = 1;
    cimg::fseek(local_130,__off,0);
  }
  cimg::fseek(local_130,offset,0);
  buf._data._7_1_ = 0;
  assign(this,_size_z,_size_c,nfile._4_4_,(uint)nfile,(char *)((long)&buf._data + 7));
  if ((__size_y == 0) || ((is_multiplexed && (size_c != 1)))) {
    if (__size_y != 0) {
      CImg((CImg<char> *)&y,1,1,1,(uint)nfile);
      for (x = 0; x < (int)this->_depth; x = x + 1) {
        for (local_a0 = 0; (int)local_a0 < (int)this->_height; local_a0 = local_a0 + 1) {
          for (local_a4 = 0; (int)local_a4 < (int)this->_width; local_a4 = local_a4 + 1) {
            cimg::fread<char>((char *)buf._16_8_,(ulong)(uint)nfile,(FILE *)local_130);
            if (invert_endianness) {
              cimg::invert_endianness<char>((char *)buf._16_8_,(ulong)(uint)nfile);
            }
            set_vector_at<char>(this,(CImg<char> *)&y,local_a4,local_a0,x);
          }
        }
      }
      ~CImg((CImg<char> *)&y);
    }
  }
  else {
    cimg::fread<char>(this->_data,__size_y,(FILE *)local_130);
    if (invert_endianness) {
      cimg::invert_endianness<char>(this->_data,__size_y);
    }
  }
  if (file == (FILE *)0x0) {
    cimg::fclose(local_130);
  }
  return this;
}

Assistant:

CImg<T>& _load_raw(std::FILE *const file, const char *const filename,
		       const unsigned int size_x, const unsigned int size_y,
		       const unsigned int size_z, const unsigned int size_c,
		       const bool is_multiplexed, const bool invert_endianness,
                       const ulongT offset) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_raw(): Specified filename is (null).",
                                    cimg_instance);
      if (cimg::is_directory(filename))
        throw CImgArgumentException(_cimg_instance
                                    "load_raw(): Specified filename '%s' is a directory.",
                                    cimg_instance,filename);

      ulongT siz = (ulongT)size_x*size_y*size_z*size_c;
      unsigned int
        _size_x = size_x,
        _size_y = size_y,
        _size_z = size_z,
        _size_c = size_c;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      if (!siz) {  // Retrieve file size
        const longT fpos = cimg::ftell(nfile);
        if (fpos<0) throw CImgArgumentException(_cimg_instance
                                                "load_raw(): Cannot determine size of input file '%s'.",
                                                cimg_instance,filename?filename:"(FILE*)");
        cimg::fseek(nfile,0,SEEK_END);
        siz = cimg::ftell(nfile)/sizeof(T);
		_size_y = (unsigned int)siz;
        _size_x = _size_z = _size_c = 1;
        cimg::fseek(nfile,fpos,SEEK_SET);
      }
      cimg::fseek(nfile,offset,SEEK_SET);
      assign(_size_x,_size_y,_size_z,_size_c,0);
      if (siz && (!is_multiplexed || size_c==1)) {
        cimg::fread(_data,siz,nfile);
        if (invert_endianness) cimg::invert_endianness(_data,siz);
      } else if (siz) {
        CImg<T> buf(1,1,1,_size_c);
        cimg_forXYZ(*this,x,y,z) {
          cimg::fread(buf._data,_size_c,nfile);
          if (invert_endianness) cimg::invert_endianness(buf._data,_size_c);
          set_vector_at(buf,x,y,z);
        }
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }